

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.h
# Opt level: O0

void __thiscall
mau::LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Set
          (LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_> *this,
          basic_endpoint<asio::ip::udp> *value)

{
  basic_endpoint<asio::ip::udp> *in_RDI;
  Locker locker;
  Lock *in_stack_ffffffffffffffc8;
  
  Locker::Locker((Locker *)in_RDI,in_stack_ffffffffffffffc8);
  asio::ip::basic_endpoint<asio::ip::udp>::operator=
            (in_RDI,(basic_endpoint<asio::ip::udp> *)in_stack_ffffffffffffffc8);
  Locker::~Locker((Locker *)0x129141);
  return;
}

Assistant:

void Set(const T& value)
    {
        Locker locker(TheLock);
        Value = value;
    }